

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

MIR_item_t_conflict MIR_new_bss(MIR_context_t ctx,char *name,size_t len)

{
  MIR_module_t pMVar1;
  MIR_item_t_conflict pMVar2;
  MIR_func_t pMVar3;
  char *pcVar4;
  MIR_item_t_conflict pMVar5;
  size_t sVar6;
  MIR_item_type_t MVar7;
  long lVar8;
  MIR_context_t ctx_00;
  MIR_str_t str;
  undefined1 auVar9 [16];
  string_t sStack_80;
  long lStack_68;
  undefined8 uStack_60;
  MIR_module_t pMStack_58;
  undefined8 uStack_50;
  MIR_item_t_conflict pMStack_48;
  MIR_context_t pMStack_40;
  size_t sStack_38;
  
  pMVar2 = create_item(ctx,MIR_bss_item,"bss");
  pMVar3 = (MIR_func_t)malloc(0x10);
  (pMVar2->u).func = pMVar3;
  if (pMVar3 != (MIR_func_t)0x0) {
    if (name == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = get_ctx_str(ctx,name);
    }
    ((pMVar2->u).func)->name = pcVar4;
    ((pMVar2->u).bss)->len = len;
    if (pcVar4 == (char *)0x0) {
      DLIST_MIR_item_t_append(&ctx->curr_module->items,pMVar2);
    }
    else {
      pMVar5 = add_item(ctx,pMVar2);
      if (pMVar5 != pMVar2) {
        free(pMVar2);
        pMVar2 = pMVar5;
      }
    }
    return pMVar2;
  }
  free(pMVar2);
  MVar7 = 0x1aedff;
  lVar8 = 3;
  auVar9 = (*ctx->error_func)(MIR_alloc_error,"Not enough memory for creation of bss %s",name);
  uStack_50 = auVar9._0_8_;
  pMVar1 = *(MIR_module_t *)(lVar8 + 0x88);
  pMStack_48 = pMVar2;
  pMStack_40 = ctx;
  sStack_38 = len;
  if (pMVar1 == (MIR_module_t)0x0) {
    pcVar4 = "%s outside module";
    ctx_00 = (MIR_context_t)0x5;
  }
  else {
    pMStack_58 = (MIR_module_t)0x130d5f;
    pMVar2 = (MIR_item_t_conflict)malloc(0x48);
    if (pMVar2 != (MIR_item_t_conflict)0x0) {
      pMVar2->data = (void *)0x0;
      pMVar2->module = pMVar1;
      pMVar2->item_type = MVar7;
      pMVar2->ref_def = (MIR_item_t)0x0;
      pMVar2->addr = (void *)0x0;
      pMVar2->export_p = '\0';
      pMVar2->section_head_p = '\0';
      return pMVar2;
    }
    pcVar4 = "Not enough memory for creation of item %s";
    ctx_00 = (MIR_context_t)0x3;
  }
  pMStack_58 = (MIR_module_t)get_ctx_str;
  (**(code **)(lVar8 + 0x10))(ctx_00,pcVar4,auVar9._8_8_);
  lStack_68 = lVar8;
  uStack_60 = auVar9._8_8_;
  pMStack_58 = pMVar1;
  sVar6 = strlen(pcVar4);
  str.s = pcVar4;
  str.len = sVar6 + 1;
  string_store(&sStack_80,ctx_00,&ctx_00->string_ctx->strings,&ctx_00->string_ctx->string_tab,str);
  return (MIR_item_t_conflict)sStack_80.str.s;
}

Assistant:

MIR_item_t MIR_new_bss (MIR_context_t ctx, const char *name, size_t len) {
  MIR_item_t tab_item, item = create_item (ctx, MIR_bss_item, "bss");

  item->u.bss = malloc (sizeof (struct MIR_bss));
  if (item->u.bss == NULL) {
    free (item);
    MIR_get_error_func (ctx) (MIR_alloc_error, "Not enough memory for creation of bss %s", name);
  }
  if (name != NULL) name = get_ctx_str (ctx, name);
  item->u.bss->name = name;
  item->u.bss->len = len;
  if (name == NULL) {
    DLIST_APPEND (MIR_item_t, curr_module->items, item);
  } else if ((tab_item = add_item (ctx, item)) != item) {
    free (item);
    item = tab_item;
  }
  return item;
}